

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_write_record(mbedtls_ssl_context *ssl)

{
  uchar uVar1;
  uchar *puVar2;
  uchar *puVar3;
  int ret_00;
  size_t sVar4;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 uVar5;
  size_t local_30;
  size_t len;
  int out_msg_type;
  int done;
  int ret;
  mbedtls_ssl_context *ssl_local;
  
  uVar5 = (undefined4)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  local_30 = ssl->out_msglen;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0xa8d,"=> write record");
  if (((((*(uint *)&ssl->conf->field_0x174 >> 1 & 1) != 1) ||
       (ssl->handshake == (mbedtls_ssl_handshake_params *)0x0)) ||
      (ssl->handshake->retransmit_state != '\x01')) && (ssl->out_msgtype == 0x16)) {
    uVar1 = *ssl->out_msg;
    if ((uVar1 != '\0') && (ssl->handshake == (mbedtls_ssl_handshake_params *)0x0)) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0xa9f,"should never happen");
      return -0x6c00;
    }
    ssl->out_msg[1] = (uchar)(local_30 - 4 >> 0x10);
    ssl->out_msg[2] = (uchar)(local_30 - 4 >> 8);
    ssl->out_msg[3] = (char)local_30 + 0xfc;
    if ((*(uint *)&ssl->conf->field_0x174 >> 1 & 1) == 1) {
      memmove(ssl->out_msg + 0xc,ssl->out_msg + 4,local_30 - 4);
      ssl->out_msglen = ssl->out_msglen + 8;
      local_30 = local_30 + 8;
      if (uVar1 == '\0') {
        ssl->out_msg[4] = '\0';
        ssl->out_msg[5] = '\0';
      }
      else {
        ssl->out_msg[4] = (uchar)(ssl->handshake->out_msg_seq >> 8);
        ssl->out_msg[5] = (uchar)ssl->handshake->out_msg_seq;
        ssl->handshake->out_msg_seq = ssl->handshake->out_msg_seq + 1;
      }
      memset(ssl->out_msg + 6,0,3);
      puVar3 = ssl->out_msg;
      puVar2 = ssl->out_msg;
      *(undefined2 *)(puVar3 + 9) = *(undefined2 *)(puVar2 + 1);
      puVar3[0xb] = puVar2[3];
    }
    if (uVar1 != '\0') {
      (*ssl->handshake->update_checksum)(ssl,ssl->out_msg,local_30);
    }
  }
  if ((((*(uint *)&ssl->conf->field_0x174 >> 1 & 1) == 1) &&
      (ssl->handshake != (mbedtls_ssl_handshake_params *)0x0)) &&
     ((ssl->handshake->retransmit_state != '\x01' &&
      (((ssl->out_msgtype == 0x14 || (ssl->out_msgtype == 0x16)) &&
       (ssl_local._4_4_ = ssl_flight_append(ssl), ssl_local._4_4_ != 0)))))) {
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0xad7,"ssl_flight_append",ssl_local._4_4_);
  }
  else {
    *ssl->out_hdr = (uchar)ssl->out_msgtype;
    mbedtls_ssl_write_version
              (ssl->major_ver,ssl->minor_ver,*(uint *)&ssl->conf->field_0x174 >> 1 & 1,
               ssl->out_hdr + 1);
    *ssl->out_len = (uchar)(local_30 >> 8);
    ssl->out_len[1] = (uchar)local_30;
    if (ssl->transform_out != (mbedtls_ssl_transform *)0x0) {
      ret_00 = ssl_encrypt_buf(ssl);
      if (ret_00 != 0) {
        mbedtls_debug_print_ret
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                   ,0xb08,"ssl_encrypt_buf",ret_00);
        return ret_00;
      }
      sVar4 = ssl->out_msglen;
      *ssl->out_len = (uchar)(sVar4 >> 8);
      ssl->out_len[1] = (uchar)sVar4;
    }
    sVar4 = mbedtls_ssl_hdr_len(ssl);
    ssl->out_left = sVar4 + ssl->out_msglen;
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0xb16,"output record: msgtype = %d, version = [%d:%d], msglen = %d",
               (ulong)*ssl->out_hdr,CONCAT44(uVar5,(uint)ssl->out_hdr[1]),(uint)ssl->out_hdr[2],
               (uint)CONCAT11(*ssl->out_len,ssl->out_len[1]));
    puVar3 = ssl->out_hdr;
    sVar4 = mbedtls_ssl_hdr_len(ssl);
    mbedtls_debug_print_buf
              (ssl,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0xb19,"output record sent to network",puVar3,sVar4 + ssl->out_msglen);
    ssl_local._4_4_ = mbedtls_ssl_flush_output(ssl);
    if (ssl_local._4_4_ == 0) {
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0xb22,"<= write record");
      ssl_local._4_4_ = 0;
    }
    else {
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0xb1e,"mbedtls_ssl_flush_output",ssl_local._4_4_);
    }
  }
  return ssl_local._4_4_;
}

Assistant:

int mbedtls_ssl_write_record( mbedtls_ssl_context *ssl )
{
    int ret, done = 0, out_msg_type;
    size_t len = ssl->out_msglen;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> write record" ) );

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        ssl->handshake != NULL &&
        ssl->handshake->retransmit_state == MBEDTLS_SSL_RETRANS_SENDING )
    {
        ; /* Skip special handshake treatment when resending */
    }
    else
#endif
    if( ssl->out_msgtype == MBEDTLS_SSL_MSG_HANDSHAKE )
    {
        out_msg_type = ssl->out_msg[0];

        if( out_msg_type != MBEDTLS_SSL_HS_HELLO_REQUEST &&
            ssl->handshake == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }

        ssl->out_msg[1] = (unsigned char)( ( len - 4 ) >> 16 );
        ssl->out_msg[2] = (unsigned char)( ( len - 4 ) >>  8 );
        ssl->out_msg[3] = (unsigned char)( ( len - 4 )       );

        /*
         * DTLS has additional fields in the Handshake layer,
         * between the length field and the actual payload:
         *      uint16 message_seq;
         *      uint24 fragment_offset;
         *      uint24 fragment_length;
         */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
        if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
        {
            /* Make room for the additional DTLS fields */
            memmove( ssl->out_msg + 12, ssl->out_msg + 4, len - 4 );
            ssl->out_msglen += 8;
            len += 8;

            /* Write message_seq and update it, except for HelloRequest */
            if( out_msg_type != MBEDTLS_SSL_HS_HELLO_REQUEST )
            {
                ssl->out_msg[4] = ( ssl->handshake->out_msg_seq >> 8 ) & 0xFF;
                ssl->out_msg[5] = ( ssl->handshake->out_msg_seq      ) & 0xFF;
                ++( ssl->handshake->out_msg_seq );
            }
            else
            {
                ssl->out_msg[4] = 0;
                ssl->out_msg[5] = 0;
            }

            /* We don't fragment, so frag_offset = 0 and frag_len = len */
            memset( ssl->out_msg + 6, 0x00, 3 );
            memcpy( ssl->out_msg + 9, ssl->out_msg + 1, 3 );
        }
#endif /* MBEDTLS_SSL_PROTO_DTLS */

        if( out_msg_type != MBEDTLS_SSL_HS_HELLO_REQUEST )
            ssl->handshake->update_checksum( ssl, ssl->out_msg, len );
    }

    /* Save handshake and CCS messages for resending */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        ssl->handshake != NULL &&
        ssl->handshake->retransmit_state != MBEDTLS_SSL_RETRANS_SENDING &&
        ( ssl->out_msgtype == MBEDTLS_SSL_MSG_CHANGE_CIPHER_SPEC ||
          ssl->out_msgtype == MBEDTLS_SSL_MSG_HANDSHAKE ) )
    {
        if( ( ret = ssl_flight_append( ssl ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "ssl_flight_append", ret );
            return( ret );
        }
    }
#endif

#if defined(MBEDTLS_ZLIB_SUPPORT)
    if( ssl->transform_out != NULL &&
        ssl->session_out->compression == MBEDTLS_SSL_COMPRESS_DEFLATE )
    {
        if( ( ret = ssl_compress_buf( ssl ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "ssl_compress_buf", ret );
            return( ret );
        }

        len = ssl->out_msglen;
    }
#endif /*MBEDTLS_ZLIB_SUPPORT */

#if defined(MBEDTLS_SSL_HW_RECORD_ACCEL)
    if( mbedtls_ssl_hw_record_write != NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "going for mbedtls_ssl_hw_record_write()" ) );

        ret = mbedtls_ssl_hw_record_write( ssl );
        if( ret != 0 && ret != MBEDTLS_ERR_SSL_HW_ACCEL_FALLTHROUGH )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_hw_record_write", ret );
            return( MBEDTLS_ERR_SSL_HW_ACCEL_FAILED );
        }

        if( ret == 0 )
            done = 1;
    }
#endif /* MBEDTLS_SSL_HW_RECORD_ACCEL */
    if( !done )
    {
        ssl->out_hdr[0] = (unsigned char) ssl->out_msgtype;
        mbedtls_ssl_write_version( ssl->major_ver, ssl->minor_ver,
                           ssl->conf->transport, ssl->out_hdr + 1 );

        ssl->out_len[0] = (unsigned char)( len >> 8 );
        ssl->out_len[1] = (unsigned char)( len      );

        if( ssl->transform_out != NULL )
        {
            if( ( ret = ssl_encrypt_buf( ssl ) ) != 0 )
            {
                MBEDTLS_SSL_DEBUG_RET( 1, "ssl_encrypt_buf", ret );
                return( ret );
            }

            len = ssl->out_msglen;
            ssl->out_len[0] = (unsigned char)( len >> 8 );
            ssl->out_len[1] = (unsigned char)( len      );
        }

        ssl->out_left = mbedtls_ssl_hdr_len( ssl ) + ssl->out_msglen;

        MBEDTLS_SSL_DEBUG_MSG( 3, ( "output record: msgtype = %d, "
                            "version = [%d:%d], msglen = %d",
                       ssl->out_hdr[0], ssl->out_hdr[1], ssl->out_hdr[2],
                     ( ssl->out_len[0] << 8 ) | ssl->out_len[1] ) );

        MBEDTLS_SSL_DEBUG_BUF( 4, "output record sent to network",
                       ssl->out_hdr, mbedtls_ssl_hdr_len( ssl ) + ssl->out_msglen );
    }

    if( ( ret = mbedtls_ssl_flush_output( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_flush_output", ret );
        return( ret );
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= write record" ) );

    return( 0 );
}